

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O3

string * __thiscall
deqp::sl::ShaderCase::specializeVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,ShaderCase *this,char *src,ValueBlock *valueBlock)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  string *__return_storage_ptr___00;
  char *pcVar5;
  DataType DVar6;
  ulong uVar7;
  size_t sVar8;
  char *__s;
  char *__s_00;
  long lVar9;
  char *pcVar10;
  ostream *poVar11;
  pointer pVVar12;
  long lVar13;
  long lVar14;
  StringTemplate tmpl;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream decl;
  ostringstream setup;
  ostringstream output;
  undefined1 auStack_568 [8];
  long local_560;
  allocator<char> local_551;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_530;
  ValueBlock *local_4f0;
  char *local_4e8;
  string *local_4e0;
  char *local_4d8;
  char *local_4d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c8;
  undefined1 local_498 [376];
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  local_4f0 = valueBlock;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uVar7 = (ulong)this->m_targetVersion;
  if (uVar7 < 7) {
    pcVar10 = *(char **)(&DAT_0210b630 + uVar7 * 8);
    local_4d0 = *(char **)(&DAT_0210b668 + uVar7 * 8);
  }
  else {
    local_4d0 = "out";
    pcVar10 = "in";
  }
  local_4e8 = src;
  local_4e0 = __return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"gl_Position = dEQP_Position;\n",0x1d);
  sVar8 = strlen(pcVar10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar10,sVar8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_498," highp vec4 dEQP_Position;\n",0x1b);
  pVVar12 = (local_4f0->values).
            super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_4d8 = pcVar10;
  if (0 < (int)((ulong)((long)(local_4f0->values).
                              super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar12) >> 3) *
          0x38e38e39) {
    lVar14 = 0x28;
    lVar9 = 0;
    do {
      pcVar10 = *(char **)((long)pVVar12 + lVar14 + -0x20);
      local_560 = lVar9;
      DVar6 = glu::getDataTypeFloatScalars(*(DataType *)((long)&pVVar12->storageType + lVar14));
      __s = glu::getDataTypeName(DVar6);
      __s_00 = glu::getDataTypeName(*(DataType *)((long)&pVVar12->storageType + lVar14));
      iVar4 = *(int *)((long)pVVar12 + lVar14 + -0x28);
      if (iVar4 == 2) {
        DVar6 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar12->storageType + lVar14));
        pcVar5 = local_4d0;
        sVar8 = strlen(local_4d0);
        if (DVar6 == TYPE_FLOAT) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar5,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
          if (__s == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar8 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
LAB_00d9d13d:
          poVar11 = (ostream *)local_498;
          if (pcVar10 == (char *)0x0) {
            lVar13 = 2;
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
            pcVar10 = ";\n";
          }
          else {
            sVar8 = strlen(pcVar10);
            lVar13 = 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar8);
            pcVar10 = ";\n";
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar5,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
          if (__s == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar8 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," v_",3);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar8 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar10,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,";\n",2);
          if (__s_00 == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar8 = strlen(__s_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s_00,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar8 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar10,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,";\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"v_",2);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x3c0
                           );
          }
          else {
            sVar8 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
          if (__s == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x3c0
                           );
          }
          else {
            sVar8 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
          if (pcVar10 == (char *)0x0) {
            lVar13 = 3;
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x3c0
                           );
            poVar11 = (ostream *)local_1a8;
            pcVar10 = ");\n";
          }
          else {
            sVar8 = strlen(pcVar10);
            lVar13 = 3;
            poVar11 = (ostream *)local_1a8;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar8);
            pcVar10 = ");\n";
          }
        }
LAB_00d9d606:
        lVar9 = local_560;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,lVar13);
      }
      else {
        lVar9 = local_560;
        if (iVar4 == 1) {
          DVar6 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar12->storageType + lVar14));
          pcVar5 = local_4d8;
          sVar8 = strlen(local_4d8);
          if (DVar6 == TYPE_FLOAT) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar5,sVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
            if (__s == (char *)0x0) {
              std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) +
                              0xd0);
            }
            else {
              sVar8 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
            goto LAB_00d9d13d;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar5,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," ",1);
          if (__s == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar8 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," a_",3);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_498._0_8_ + -0x18) + 0xd0)
            ;
          }
          else {
            sVar8 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar10,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,";\n",2);
          if (__s_00 == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x248
                           );
          }
          else {
            sVar8 = strlen(__s_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,__s_00,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x248
                           );
          }
          else {
            sVar8 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar10,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," = ",3);
          if (__s_00 == (char *)0x0) {
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x248
                           );
          }
          else {
            sVar8 = strlen(__s_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,__s_00,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"(a_",3);
          if (pcVar10 == (char *)0x0) {
            lVar13 = 3;
            std::ios::clear((int)auStack_568 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x248
                           );
            poVar11 = (ostream *)local_320;
            pcVar10 = ");\n";
          }
          else {
            sVar8 = strlen(pcVar10);
            lVar13 = 3;
            poVar11 = (ostream *)local_320;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,sVar8);
            pcVar10 = ");\n";
          }
          goto LAB_00d9d606;
        }
      }
      lVar9 = lVar9 + 1;
      pVVar12 = (local_4f0->values).
                super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x48;
    } while (lVar9 < (int)((ulong)((long)(local_4f0->values).
                                         super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar12)
                          >> 3) * 0x38e38e39);
  }
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4c8._M_impl.super__Rb_tree_header._M_header;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_530,(char (*) [13])0x1cac47c,&local_550);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_4c8,&local_530);
  paVar1 = &local_530.second.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_530.second._M_dataplus._M_p,
                    local_530.second.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_530.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_530.first._M_dataplus._M_p,
                    local_530.first.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_550.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != paVar3) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_530,(char (*) [6])0x1ab00f3,&local_550);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_4c8,&local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_530.second._M_dataplus._M_p,
                    local_530.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_530.first._M_dataplus._M_p,
                    local_530.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != paVar3) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_530,(char (*) [7])0x1cb3f3f,&local_550);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_4c8,&local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_530.second._M_dataplus._M_p,
                    local_530.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_530.first._M_dataplus._M_p,
                    local_530.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != paVar3) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[12],_true>
            (&local_530,(char (*) [20])"POSITION_FRAG_COLOR",(char (*) [12])0x19eeb36);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_4c8,&local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_530.second._M_dataplus._M_p,
                    local_530.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_530.first._M_dataplus._M_p,
                    local_530.first.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,local_4e8,&local_551);
  __return_storage_ptr___00 = local_4e0;
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_530,&local_550);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != paVar3) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::specialize
            (__return_storage_ptr___00,(StringTemplate *)&local_530,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_4c8);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_530);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_4c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base((ios_base *)(local_498 + 0x70));
  return __return_storage_ptr___00;
}

Assistant:

string ShaderCase::specializeVertexShader(const char* src, const ValueBlock& valueBlock)
{
	ostringstream decl;
	ostringstream setup;
	ostringstream output;
	const bool	usesInout = usesShaderInoutQualifiers(m_targetVersion);
	const char*   vtxIn		= usesInout ? "in" : "attribute";
	const char*   vtxOut	= usesInout ? "out" : "varying";

	// Output (write out position).
	output << "gl_Position = dEQP_Position;\n";

	// Declarations (position + attribute for each input, varying for each output).
	decl << vtxIn << " highp vec4 dEQP_Position;\n";
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val		  = valueBlock.values[ndx];
		const char*				 valueName	= val.valueName.c_str();
		DataType				 floatType	= getDataTypeFloatScalars(val.dataType);
		const char*				 floatTypeStr = getDataTypeName(floatType);
		const char*				 refTypeStr   = getDataTypeName(val.dataType);

		if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
		{
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
			{
				decl << vtxIn << " " << floatTypeStr << " " << valueName << ";\n";
			}
			else
			{
				decl << vtxIn << " " << floatTypeStr << " a_" << valueName << ";\n";
				setup << refTypeStr << " " << valueName << " = " << refTypeStr << "(a_" << valueName << ");\n";
			}
		}
		else if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
		{
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				decl << vtxOut << " " << floatTypeStr << " " << valueName << ";\n";
			else
			{
				decl << vtxOut << " " << floatTypeStr << " v_" << valueName << ";\n";
				decl << refTypeStr << " " << valueName << ";\n";

				output << "v_" << valueName << " = " << floatTypeStr << "(" << valueName << ");\n";
			}
		}
	}

	// Shader specialization.
	map<string, string> params;
	params.insert(pair<string, string>("DECLARATIONS", decl.str()));
	params.insert(pair<string, string>("SETUP", setup.str()));
	params.insert(pair<string, string>("OUTPUT", output.str()));
	params.insert(pair<string, string>("POSITION_FRAG_COLOR", "gl_Position"));

	StringTemplate tmpl(src);
	return tmpl.specialize(params);
}